

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

bool __thiscall cmListFile::ParseFile(cmListFile *this,char *filename,bool topLevel,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  undefined7 in_register_00000011;
  pointer pcVar6;
  string name;
  cmListFileParser parser;
  value_type local_148;
  allocator local_115;
  undefined4 local_114;
  pointer *local_110;
  cmMakefile *local_108;
  undefined1 local_100 [8];
  undefined1 local_f8 [8];
  cmListFile local_f0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  undefined1 auStack_b8 [24];
  long local_a0;
  pointer pcStack_98;
  pointer local_90;
  pointer pcStack_88;
  cmListFile *local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  local_108 = mf;
  bVar2 = cmsys::SystemTools::FileExists(filename);
  bVar3 = true;
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_50,filename,&local_115);
    bVar3 = cmsys::SystemTools::FileIsDirectory(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar3 != false) {
    return false;
  }
  local_114 = (undefined4)CONCAT71(in_register_00000011,topLevel);
  local_f8 = (undefined1  [8])local_108;
  local_100 = (undefined1  [8])this;
  local_f0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)filename;
  local_f0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)cmListFileLexer_New();
  local_d8 = 0;
  local_d0._M_local_buf[0] = '\0';
  local_c0._M_p = auStack_b8 + 8;
  auStack_b8._0_8_ = (pointer)0x0;
  auStack_b8._8_8_ = auStack_b8._8_8_ & 0xffffffffffffff00;
  local_a0 = 0;
  pcStack_98 = (pointer)0x0;
  local_90 = (pointer)0x0;
  pcStack_88 = (pointer)0x0;
  local_f0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_d0;
  bVar3 = cmListFileParser::ParseFile((cmListFileParser *)local_100);
  cmListFileParser::~cmListFileParser((cmListFileParser *)local_100);
  if ((char)local_114 == '\0') {
    return bVar3;
  }
  pcVar6 = (this->Functions).
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar6 != (this->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      cmsys::SystemTools::LowerCase((string *)local_100,(string *)pcVar6);
      iVar4 = std::__cxx11::string::compare((char *)local_100);
      if (local_100 != (undefined1  [8])&local_f0) {
        operator_delete((void *)local_100,
                        (ulong)((long)local_f0.Functions.
                                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      if (iVar4 == 0) {
        local_110 = &(this->Functions).
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
        goto LAB_003ac7d4;
      }
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 != (this->Functions).
                       super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  local_110 = &(this->Functions).
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_finish;
  if ((ulong)(((long)(this->Functions).
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->Functions).
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555) < 0x1e) {
    local_f0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_f8;
    local_f8 = (undefined1  [8])((ulong)local_f8 & 0xffffffff00000000);
    local_f0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8 = 0;
    paVar1 = &local_148.Value.field_2;
    local_148.Value._M_dataplus._M_p = (pointer)paVar1;
    local_f0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_f0.Functions.
         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"project","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_100,&local_148.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_148.Value._M_dataplus._M_p,
                      local_148.Value.field_2._M_allocated_capacity + 1);
    }
    local_148.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"set","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_100,&local_148.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_148.Value._M_dataplus._M_p,
                      local_148.Value.field_2._M_allocated_capacity + 1);
    }
    local_148.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"if","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_100,&local_148.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_148.Value._M_dataplus._M_p,
                      local_148.Value.field_2._M_allocated_capacity + 1);
    }
    local_148.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"endif","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_100,&local_148.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_148.Value._M_dataplus._M_p,
                      local_148.Value.field_2._M_allocated_capacity + 1);
    }
    local_148.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"else","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_100,&local_148.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_148.Value._M_dataplus._M_p,
                      local_148.Value.field_2._M_allocated_capacity + 1);
    }
    local_148.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"elseif","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_100,&local_148.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_148.Value._M_dataplus._M_p,
                      local_148.Value.field_2._M_allocated_capacity + 1);
    }
    local_148.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"add_executable","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_100,&local_148.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_148.Value._M_dataplus._M_p,
                      local_148.Value.field_2._M_allocated_capacity + 1);
    }
    local_148.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"add_library","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_100,&local_148.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_148.Value._M_dataplus._M_p,
                      local_148.Value.field_2._M_allocated_capacity + 1);
    }
    local_148.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"target_link_libraries","")
    ;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_100,&local_148.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_148.Value._M_dataplus._M_p,
                      local_148.Value.field_2._M_allocated_capacity + 1);
    }
    local_148.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"option","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_100,&local_148.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_148.Value._M_dataplus._M_p,
                      local_148.Value.field_2._M_allocated_capacity + 1);
    }
    local_148.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"message","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_100,&local_148.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_148.Value._M_dataplus._M_p,
                      local_148.Value.field_2._M_allocated_capacity + 1);
    }
    pcVar6 = (this->Functions).
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar6 == (this->Functions).
                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_100);
      goto LAB_003ac7d4;
    }
    bVar2 = false;
    local_78 = this;
    do {
      cmsys::SystemTools::LowerCase(&local_148.Value,(string *)pcVar6);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_100,&local_148.Value);
      if (iVar5._M_node == (_Base_ptr)local_f8) {
        bVar2 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148.Value._M_dataplus._M_p != &local_148.Value.field_2) {
        operator_delete(local_148.Value._M_dataplus._M_p,
                        local_148.Value.field_2._M_allocated_capacity + 1);
      }
    } while ((iVar5._M_node != (_Base_ptr)local_f8) && (pcVar6 = pcVar6 + 1, pcVar6 != *local_110));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
    this = local_78;
    if (!bVar2) goto LAB_003ac7d4;
  }
  local_108->CheckCMP0000 = true;
  cmMakefile::SetPolicyVersion(local_108,"2.4");
LAB_003ac7d4:
  if ((char)local_114 != '\0') {
    pcVar6 = (this->Functions).
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar6 != (this->Functions).
                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      do {
        cmsys::SystemTools::LowerCase((string *)local_100,(string *)pcVar6);
        iVar4 = std::__cxx11::string::compare((char *)local_100);
        if (local_100 != (undefined1  [8])&local_f0) {
          operator_delete((void *)local_100,
                          (ulong)((long)local_f0.Functions.
                                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        if (iVar4 == 0) {
          return bVar3;
        }
        pcVar6 = pcVar6 + 1;
      } while (pcVar6 != *local_110);
    }
    local_f8 = (undefined1  [8])0x0;
    local_f0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_f0.Functions.
                          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    local_f0.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_d0;
    local_d8 = 0;
    local_d0._M_local_buf[0] = '\0';
    local_c0._M_p = (pointer)0x0;
    auStack_b8._0_8_ = (pointer)0x0;
    auStack_b8._8_8_ = 0;
    auStack_b8._16_8_ = 0;
    local_100 = (undefined1  [8])&local_f0;
    std::__cxx11::string::_M_replace((ulong)local_100,0,(char *)0x0,0x4ca95f);
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Project","");
    paVar1 = &local_148.Value.field_2;
    local_148.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,local_70,local_68 + (long)local_70);
    local_148.Delim = Unquoted;
    local_148.Line = 0;
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)auStack_b8,
               &local_148);
    std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
              (&this->Functions,
               (this->Functions).
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start,(value_type *)local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_148.Value._M_dataplus._M_p,
                      local_148.Value.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)auStack_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage != &local_d0) {
      operator_delete(local_f0.Functions.
                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0]) + 1);
    }
    if (local_100 != (undefined1  [8])&local_f0) {
      operator_delete((void *)local_100,
                      (ulong)((long)local_f0.Functions.
                                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  return bVar3;
}

Assistant:

bool cmListFile::ParseFile(const char* filename,
                           bool topLevel,
                           cmMakefile *mf)
{
  if(!cmSystemTools::FileExists(filename) ||
     cmSystemTools::FileIsDirectory(filename))
    {
    return false;
    }

  bool parseError = false;

  {
  cmListFileParser parser(this, mf, filename);
  parseError = !parser.ParseFile();
  }

  // do we need a cmake_policy(VERSION call?
  if(topLevel)
  {
    bool hasVersion = false;
    // search for the right policy command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
    {
      if (cmSystemTools::LowerCase(i->Name) == "cmake_minimum_required")
      {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if(!hasVersion)
    {
      bool isProblem = true;
      if (this->Functions.size() < 30)
      {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for(std::vector<cmListFileFunction>::iterator i
              = this->Functions.begin();
            i != this->Functions.end(); ++i)
        {
          std::string name = cmSystemTools::LowerCase(i->Name);
          if (allowedCommands.find(name) == allowedCommands.end())
          {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem)
      {
      // Tell the top level cmMakefile to diagnose
      // this violation of CMP0000.
      mf->SetCheckCMP0000(true);

      // Implicitly set the version for the user.
      mf->SetPolicyVersion("2.4");
      }
    }
  }

  if(topLevel)
    {
    bool hasProject = false;
    // search for a project command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
      {
      if(cmSystemTools::LowerCase(i->Name) == "project")
        {
        hasProject = true;
        break;
        }
      }
    // if no project command is found, add one
    if(!hasProject)
      {
      cmListFileFunction project;
      project.Name = "PROJECT";
      cmListFileArgument prj("Project", cmListFileArgument::Unquoted, 0);
      project.Arguments.push_back(prj);
      this->Functions.insert(this->Functions.begin(),project);
      }
    }
  if(parseError)
    {
    return false;
    }
  return true;
}